

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  DeepScanLineOutputFile file;
  Header f;
  long *local_90;
  long local_88;
  long local_80 [2];
  undefined8 local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  Header local_50 [56];
  
  local_70 = 0;
  Imf_3_4::Header::Header(local_50,0x40,0x40,1.0,(Vec2 *)&local_70,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  pcVar4 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&local_70,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar4,(Channel *)"Dummy");
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012f897;
    }
  }
  else {
LAB_0012f897:
    Imf_3_4::Header::setType((string *)local_50);
  }
  puVar5 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar5 = 2;
  remove("/var/tmp/badfile.exr");
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
            ((DeepScanLineOutputFile *)&local_70,"/var/tmp/badfile.exr",local_50,iVar3);
  Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile((DeepScanLineOutputFile *)&local_70);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_70,"/var/tmp/badfile.exr",iVar3,true);
  if (DAT_001e8f68 == DAT_001e8fb0) {
    if (DAT_001e8f68 != 0) {
      iVar3 = bcmp(Imf_3_4::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001e8f68);
      if (iVar3 != 0) goto LAB_0012f938;
    }
  }
  else {
LAB_0012f938:
    Imf_3_4::MultiPartInputFile::header((int)&local_70);
    puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar1 = puVar6[1];
    if (sVar1 == DAT_001e8f68) {
      if (sVar1 != 0) {
        iVar3 = bcmp((void *)*puVar6,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar1);
        if (iVar3 != 0) goto LAB_0012f979;
      }
    }
    else {
LAB_0012f979:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,Imf_3_4::DEEPSCANLINE_abi_cxx11_,DAT_001e8f68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
      Imf_3_4::MultiPartInputFile::header((int)&local_70);
      puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," from multipart when input type was ",0x24);
      sVar1 = *(size_t *)(filename + 8);
      if (sVar1 == DAT_001e8fb0) {
        if (sVar1 != 0) {
          iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
          if (iVar3 != 0) goto LAB_0012fa24;
        }
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"unset","");
      }
      else {
LAB_0012fa24:
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,*(long *)filename,sVar1 + *(long *)filename);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_90,local_88);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
    }
  }
  if (DAT_001e8f68 == DAT_001e8fb0) {
    if (DAT_001e8f68 != 0) {
      iVar3 = bcmp(Imf_3_4::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001e8f68);
      if (iVar3 != 0) goto LAB_0012fae6;
    }
  }
  else {
LAB_0012fae6:
    Imf_3_4::MultiPartInputFile::header((int)&local_70);
    puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar1 = puVar6[1];
    if (sVar1 != DAT_001e8f68) {
LAB_0012fdc2:
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::DeepScanLineInputFile, OUT = Imf_3_4::DeepScanLineOutputFile]"
                   );
    }
    if (sVar1 != 0) {
      iVar3 = bcmp((void *)*puVar6,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar1);
      if (iVar3 != 0) goto LAB_0012fdc2;
    }
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
            ((DeepScanLineInputFile *)&local_70,"/var/tmp/badfile.exr",iVar3);
  if (DAT_001e8f68 == DAT_001e8fb0) {
    if (DAT_001e8f68 != 0) {
      iVar3 = bcmp(Imf_3_4::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001e8f68);
      if (iVar3 != 0) goto LAB_0012fb91;
    }
    Imf_3_4::DeepScanLineInputFile::header();
    cVar2 = Imf_3_4::Header::hasType();
    if (cVar2 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_4::DeepScanLineInputFile::header();
    cVar2 = Imf_3_4::Header::hasType();
    if (cVar2 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::DeepScanLineInputFile, OUT = Imf_3_4::DeepScanLineOutputFile]"
                   );
    }
    goto LAB_0012fd81;
  }
LAB_0012fb91:
  Imf_3_4::DeepScanLineInputFile::header();
  puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  sVar1 = puVar6[1];
  if (sVar1 == DAT_001e8f68) {
    if (sVar1 == 0) goto LAB_0012fd81;
    iVar3 = bcmp((void *)*puVar6,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar1);
    if (iVar3 == 0) goto LAB_0012fd81;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,Imf_3_4::DEEPSCANLINE_abi_cxx11_,DAT_001e8f68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
  Imf_3_4::DeepScanLineInputFile::header();
  puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," when input type was ",0x15);
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012fc81;
    }
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"unset","");
  }
  else {
LAB_0012fc81:
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,*(long *)filename,sVar1 + *(long *)filename);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_90,local_88);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
LAB_0012fd81:
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  remove("/var/tmp/badfile.exr");
  Imf_3_4::Header::~Header(local_50);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}